

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int findInodeInfo(unixFile *pFile,unixInodeInfo **ppInode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  __syscall_slong_t _Var7;
  unixInodeInfo *puVar8;
  int iVar9;
  int *piVar10;
  sqlite3_mutex *psVar11;
  bool bVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  unixInodeInfo *local_d0;
  unixInodeInfo *pInode;
  stat statbuf;
  unixFileId fileId;
  int fd;
  int rc;
  unixInodeInfo **ppInode_local;
  unixFile *pFile_local;
  
  iVar9 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h);
  if (iVar9 == 0) {
    memset(statbuf.__glibc_reserved + 2,0,0x10);
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)pInode;
    _Var7 = statbuf.__glibc_reserved[2];
    local_d0 = inodeList;
    while( true ) {
      bVar12 = false;
      if (local_d0 != (unixInodeInfo *)0x0) {
        statbuf.__glibc_reserved[2]._0_1_ = (char)pInode;
        statbuf.__glibc_reserved[2]._1_1_ = (char)((ulong)pInode >> 8);
        statbuf.__glibc_reserved[2]._2_1_ = (char)((ulong)pInode >> 0x10);
        statbuf.__glibc_reserved[2]._3_1_ = (char)((ulong)pInode >> 0x18);
        statbuf.__glibc_reserved[2]._4_1_ = (char)((ulong)pInode >> 0x20);
        statbuf.__glibc_reserved[2]._5_1_ = (char)((ulong)pInode >> 0x28);
        statbuf.__glibc_reserved[2]._6_1_ = (char)((ulong)pInode >> 0x30);
        statbuf.__glibc_reserved[2]._7_1_ = (char)((ulong)pInode >> 0x38);
        fileId.dev._0_1_ = (char)statbuf.st_dev;
        fileId.dev._1_1_ = (char)(statbuf.st_dev >> 8);
        fileId.dev._2_1_ = (char)(statbuf.st_dev >> 0x10);
        fileId.dev._3_1_ = (char)(statbuf.st_dev >> 0x18);
        fileId.dev._4_1_ = (char)(statbuf.st_dev >> 0x20);
        fileId.dev._5_1_ = (char)(statbuf.st_dev >> 0x28);
        fileId.dev._6_1_ = (char)(statbuf.st_dev >> 0x30);
        fileId.dev._7_1_ = (char)(statbuf.st_dev >> 0x38);
        cVar13 = -((char)statbuf.__glibc_reserved[2] == (char)(local_d0->fileId).dev);
        cVar14 = -(statbuf.__glibc_reserved[2]._1_1_ == *(char *)((long)&(local_d0->fileId).dev + 1)
                  );
        cVar15 = -(statbuf.__glibc_reserved[2]._2_1_ == *(char *)((long)&(local_d0->fileId).dev + 2)
                  );
        cVar16 = -(statbuf.__glibc_reserved[2]._3_1_ == *(char *)((long)&(local_d0->fileId).dev + 3)
                  );
        cVar17 = -(statbuf.__glibc_reserved[2]._4_1_ == *(char *)((long)&(local_d0->fileId).dev + 4)
                  );
        cVar18 = -(statbuf.__glibc_reserved[2]._5_1_ == *(char *)((long)&(local_d0->fileId).dev + 5)
                  );
        cVar19 = -(statbuf.__glibc_reserved[2]._6_1_ == *(char *)((long)&(local_d0->fileId).dev + 6)
                  );
        cVar20 = -(statbuf.__glibc_reserved[2]._7_1_ == *(char *)((long)&(local_d0->fileId).dev + 7)
                  );
        cVar21 = -((char)fileId.dev == (char)(local_d0->fileId).ino);
        cVar22 = -(fileId.dev._1_1_ == *(char *)((long)&(local_d0->fileId).ino + 1));
        cVar23 = -(fileId.dev._2_1_ == *(char *)((long)&(local_d0->fileId).ino + 2));
        cVar24 = -(fileId.dev._3_1_ == *(char *)((long)&(local_d0->fileId).ino + 3));
        cVar25 = -(fileId.dev._4_1_ == *(char *)((long)&(local_d0->fileId).ino + 4));
        cVar26 = -(fileId.dev._5_1_ == *(char *)((long)&(local_d0->fileId).ino + 5));
        cVar27 = -(fileId.dev._6_1_ == *(char *)((long)&(local_d0->fileId).ino + 6));
        bVar28 = -(fileId.dev._7_1_ == *(char *)((long)&(local_d0->fileId).ino + 7));
        auVar1[1] = cVar14;
        auVar1[0] = cVar13;
        auVar1[2] = cVar15;
        auVar1[3] = cVar16;
        auVar1[4] = cVar17;
        auVar1[5] = cVar18;
        auVar1[6] = cVar19;
        auVar1[7] = cVar20;
        auVar1[8] = cVar21;
        auVar1[9] = cVar22;
        auVar1[10] = cVar23;
        auVar1[0xb] = cVar24;
        auVar1[0xc] = cVar25;
        auVar1[0xd] = cVar26;
        auVar1[0xe] = cVar27;
        auVar1[0xf] = bVar28;
        auVar2[1] = cVar14;
        auVar2[0] = cVar13;
        auVar2[2] = cVar15;
        auVar2[3] = cVar16;
        auVar2[4] = cVar17;
        auVar2[5] = cVar18;
        auVar2[6] = cVar19;
        auVar2[7] = cVar20;
        auVar2[8] = cVar21;
        auVar2[9] = cVar22;
        auVar2[10] = cVar23;
        auVar2[0xb] = cVar24;
        auVar2[0xc] = cVar25;
        auVar2[0xd] = cVar26;
        auVar2[0xe] = cVar27;
        auVar2[0xf] = bVar28;
        auVar6[1] = cVar16;
        auVar6[0] = cVar15;
        auVar6[2] = cVar17;
        auVar6[3] = cVar18;
        auVar6[4] = cVar19;
        auVar6[5] = cVar20;
        auVar6[6] = cVar21;
        auVar6[7] = cVar22;
        auVar6[8] = cVar23;
        auVar6[9] = cVar24;
        auVar6[10] = cVar25;
        auVar6[0xb] = cVar26;
        auVar6[0xc] = cVar27;
        auVar6[0xd] = bVar28;
        auVar5[1] = cVar17;
        auVar5[0] = cVar16;
        auVar5[2] = cVar18;
        auVar5[3] = cVar19;
        auVar5[4] = cVar20;
        auVar5[5] = cVar21;
        auVar5[6] = cVar22;
        auVar5[7] = cVar23;
        auVar5[8] = cVar24;
        auVar5[9] = cVar25;
        auVar5[10] = cVar26;
        auVar5[0xb] = cVar27;
        auVar5[0xc] = bVar28;
        auVar4[1] = cVar18;
        auVar4[0] = cVar17;
        auVar4[2] = cVar19;
        auVar4[3] = cVar20;
        auVar4[4] = cVar21;
        auVar4[5] = cVar22;
        auVar4[6] = cVar23;
        auVar4[7] = cVar24;
        auVar4[8] = cVar25;
        auVar4[9] = cVar26;
        auVar4[10] = cVar27;
        auVar4[0xb] = bVar28;
        auVar3[1] = cVar19;
        auVar3[0] = cVar18;
        auVar3[2] = cVar20;
        auVar3[3] = cVar21;
        auVar3[4] = cVar22;
        auVar3[5] = cVar23;
        auVar3[6] = cVar24;
        auVar3[7] = cVar25;
        auVar3[8] = cVar26;
        auVar3[9] = cVar27;
        auVar3[10] = bVar28;
        bVar12 = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(
                                                  cVar25,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(
                                                  cVar22,CONCAT12(cVar21,CONCAT11(cVar20,cVar19)))))
                                                  )))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(
                                                  cVar25,CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(
                                                  cVar22,CONCAT11(cVar21,cVar20)))))))) >> 7) & 1)
                          << 7 | (ushort)(bVar28 >> 7) << 0xf) != 0xffff;
      }
      if (!bVar12) break;
      local_d0 = local_d0->pNext;
    }
    if (local_d0 == (unixInodeInfo *)0x0) {
      statbuf.__glibc_reserved[2] = _Var7;
      local_d0 = (unixInodeInfo *)sqlite3_malloc64(0x50);
      if (local_d0 == (unixInodeInfo *)0x0) {
        return 7;
      }
      memset(local_d0,0,0x50);
      (local_d0->fileId).dev = statbuf.__glibc_reserved[2];
      (local_d0->fileId).ino = statbuf.st_dev;
      if (sqlite3Config.bCoreMutex != 0) {
        psVar11 = sqlite3_mutex_alloc(0);
        local_d0->pLockMutex = psVar11;
        if (local_d0->pLockMutex == (sqlite3_mutex *)0x0) {
          sqlite3_free(local_d0);
          return 7;
        }
      }
      local_d0->nRef = 1;
      local_d0->pNext = inodeList;
      local_d0->pPrev = (unixInodeInfo *)0x0;
      puVar8 = local_d0;
      if (inodeList != (unixInodeInfo *)0x0) {
        inodeList->pPrev = local_d0;
      }
    }
    else {
      local_d0->nRef = local_d0->nRef + 1;
      puVar8 = inodeList;
    }
    inodeList = puVar8;
    *ppInode = local_d0;
    pFile_local._4_4_ = 0;
  }
  else {
    piVar10 = __errno_location();
    storeLastErrno(pFile,*piVar10);
    pFile_local._4_4_ = 10;
  }
  return pFile_local._4_4_;
}

Assistant:

static int findInodeInfo(
  unixFile *pFile,               /* Unix file with file desc used in the key */
  unixInodeInfo **ppInode        /* Return the unixInodeInfo object here */
){
  int rc;                        /* System call return code */
  int fd;                        /* The file descriptor for pFile */
  struct unixFileId fileId;      /* Lookup key for the unixInodeInfo */
  struct stat statbuf;           /* Low-level file information */
  unixInodeInfo *pInode = 0;     /* Candidate unixInodeInfo object */

  assert( unixMutexHeld() );

  /* Get low-level information about the file that we can used to
  ** create a unique name for the file.
  */
  fd = pFile->h;
  rc = osFstat(fd, &statbuf);
  if( rc!=0 ){
    storeLastErrno(pFile, errno);
#if defined(EOVERFLOW) && defined(SQLITE_DISABLE_LFS)
    if( pFile->lastErrno==EOVERFLOW ) return SQLITE_NOLFS;
#endif
    return SQLITE_IOERR;
  }

#ifdef __APPLE__
  /* On OS X on an msdos filesystem, the inode number is reported
  ** incorrectly for zero-size files.  See ticket #3260.  To work
  ** around this problem (we consider it a bug in OS X, not SQLite)
  ** we always increase the file size to 1 by writing a single byte
  ** prior to accessing the inode number.  The one byte written is
  ** an ASCII 'S' character which also happens to be the first byte
  ** in the header of every SQLite database.  In this way, if there
  ** is a race condition such that another thread has already populated
  ** the first page of the database, no damage is done.
  */
  if( statbuf.st_size==0 && (pFile->fsFlags & SQLITE_FSFLAGS_IS_MSDOS)!=0 ){
    do{ rc = osWrite(fd, "S", 1); }while( rc<0 && errno==EINTR );
    if( rc!=1 ){
      storeLastErrno(pFile, errno);
      return SQLITE_IOERR;
    }
    rc = osFstat(fd, &statbuf);
    if( rc!=0 ){
      storeLastErrno(pFile, errno);
      return SQLITE_IOERR;
    }
  }
#endif

  memset(&fileId, 0, sizeof(fileId));
  fileId.dev = statbuf.st_dev;
#if OS_VXWORKS
  fileId.pId = pFile->pId;
#else
  fileId.ino = (u64)statbuf.st_ino;
#endif
  assert( unixMutexHeld() );
  pInode = inodeList;
  while( pInode && memcmp(&fileId, &pInode->fileId, sizeof(fileId)) ){
    pInode = pInode->pNext;
  }
  if( pInode==0 ){
    pInode = sqlite3_malloc64( sizeof(*pInode) );
    if( pInode==0 ){
      return SQLITE_NOMEM_BKPT;
    }
    memset(pInode, 0, sizeof(*pInode));
    memcpy(&pInode->fileId, &fileId, sizeof(fileId));
    if( sqlite3GlobalConfig.bCoreMutex ){
      pInode->pLockMutex = sqlite3_mutex_alloc(SQLITE_MUTEX_FAST);
      if( pInode->pLockMutex==0 ){
        sqlite3_free(pInode);
        return SQLITE_NOMEM_BKPT;
      }
    }
    pInode->nRef = 1;
    assert( unixMutexHeld() );
    pInode->pNext = inodeList;
    pInode->pPrev = 0;
    if( inodeList ) inodeList->pPrev = pInode;
    inodeList = pInode;
  }else{
    pInode->nRef++;
  }
  *ppInode = pInode;
  return SQLITE_OK;
}